

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O3

exit_table_type<const_afsm::test::events::null_literal_&> *
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::array,unsigned_long>
::exit_table<afsm::test::events::null_literal_const&,0ul>(indexes_tuple<0UL> *param_1)

{
  if (exit_table<afsm::test::events::null_literal_const&,0ul>(psst::meta::indexes_tuple<0ul>const&)
      ::_table == '\0') {
    exit_table<afsm::test::events::null_literal_const&,0ul>();
  }
  return &state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::test::json_parser_def::context::array,_unsigned_long>
          ::exit_table<const_afsm::test::events::null_literal_&,_0UL>::_table;
}

Assistant:

static exit_table_type<Event> const&
    exit_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        static exit_table_type<Event> _table {{
            detail::final_state_exit_func<Indexes>{} ...
        }};
        return _table;
    }